

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

void __thiscall
Apple::IIgs::Sound::GLU::generate_audio<(Outputs::Speaker::Action)1>
          (GLU *this,size_t number_of_samples,MonoSample *target)

{
  EnsoniqState *ram;
  uint8_t *puVar1;
  atomic<Apple::IIgs::Sound::GLU::MemoryWrite> aVar2;
  int16_t iVar3;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  byte bVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  Oscillator *this_00;
  ulong uVar11;
  uint32_t local_78;
  ulong local_70;
  
  aVar2._M_i = this->pending_stores_[this->pending_store_read_]._M_i;
  if (number_of_samples != 0) {
    local_70 = (ulong)aVar2._M_i >> 0x38;
    ram = &this->remote_;
    uVar6 = (ulong)aVar2._M_i >> 0x20 & 0xffff;
    uVar9 = 0xff;
    sVar8 = 0;
    do {
      if ((this->remote_).oscillator_count < 1) {
        iVar4 = 0;
      }
      else {
        uVar11 = 0;
        iVar4 = 0;
        this_00 = (this->remote_).oscillators;
        do {
          bVar7 = this_00->control;
          if ((bVar7 & 1) == 0) {
            uVar10 = (uint)this_00->velocity + this_00->position;
            this_00->position = uVar10;
            switch(bVar7 & 6) {
            case 0:
              iVar3 = EnsoniqState::Oscillator::output(this_00,ram->ram_);
              iVar4 = iVar4 + iVar3;
              break;
            case 2:
              if ((this_00->overflow_mask & uVar10) != 0) {
                this_00->position = 0;
                this_00->control = bVar7 | 1;
              }
              break;
            case 4:
              if ((uVar11 & 1) != 0) {
                bVar7 = 8 - (this_00->table_size >> 3 & 7);
                uVar9 = (uint)ram->ram_[-0x10000 >> (bVar7 & 0x1f) & (uint)this_00->address << 8 |
                                        uVar10 >> ((this_00->table_size & 7) + bVar7 & 0x1f) &
                                        0xffffU >> (bVar7 & 0x1f)];
                goto LAB_0029f8d5;
              }
              uVar10 = uVar10 & this_00->overflow_mask;
              if (uVar10 != 0) {
                this_00->position = uVar10;
                this_00[1].position = 0;
              }
              break;
            case 6:
              if ((this_00->overflow_mask & uVar10) != 0) {
                this_00->control = bVar7 | 1;
                this_00->position = 0;
                puVar1 = &(this->remote_).oscillators[uVar11 ^ 1].control;
                *puVar1 = *puVar1 & 0xfe;
              }
            }
            if ((this_00->control & 1) == 0) {
              iVar3 = EnsoniqState::Oscillator::output(this_00,ram->ram_);
              iVar4 = (int)(uVar9 * (int)iVar3) / 0xff + iVar4;
              uVar9 = 0xff;
            }
          }
LAB_0029f8d5:
          uVar11 = uVar11 + 1;
          this_00 = this_00 + 1;
        } while ((long)uVar11 < (long)(this->remote_).oscillator_count);
      }
      target[sVar8] = target[sVar8] + (short)(this->output_range_ * iVar4 >> 0x14);
      uVar5 = this->pending_store_read_time_ + 1;
      this->pending_store_read_time_ = uVar5;
      local_78 = aVar2._M_i.time;
      if (((byte)local_70 & uVar5 == local_78) != 0) {
        (this->remote_).ram_[uVar6] = aVar2._M_i.value;
        this->pending_stores_[this->pending_store_read_]._M_i =
             (MemoryWrite)((ulong)aVar2._M_i & 0xff0000ffffffff | uVar6 << 0x20);
        this->pending_store_read_ = this->pending_store_read_ + 1 & 0x3fff;
        local_70 = 0;
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != number_of_samples);
  }
  return;
}

Assistant:

void GLU::generate_audio(size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	auto next_store = pending_stores_[pending_store_read_].load(std::memory_order::memory_order_acquire);
	uint8_t next_amplitude = 255;
	for(size_t sample = 0; sample < number_of_samples; sample++) {

		// TODO: there's a bit of a hack here where it is assumed that the input clock has been
		// divided in advance. Real hardware divides by 8, I think?

		// Seed output as 0.
		int output = 0;

		// Apply phase updates to all enabled oscillators.
		for(int c = 0; c < remote_.oscillator_count; c++) {
			// Don't do anything for halted oscillators.
			if(remote_.oscillators[c].control&1) continue;

			remote_.oscillators[c].position += remote_.oscillators[c].velocity;

			// Test for a new halting event.
			switch(remote_.oscillators[c].control & 6) {
				case 0:	// Free-run mode; don't truncate the position at all, in case the
						// accumulator bits in use changes.
					output += remote_.oscillators[c].output(remote_.ram_);
				break;

				case 2:	// One-shot mode; check for end of run. Otherwise update sample.
					if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
						remote_.oscillators[c].position = 0;
						remote_.oscillators[c].control |= 1;
					}
				break;

				case 4:	// Sync/AM mode.
					if(c&1) {
						// Oscillator is odd-numbered; it will amplitude-modulate the next voice.
						next_amplitude = remote_.oscillators[c].sample(remote_.ram_);
						continue;
					} else {
						// Oscillator is even-numbered; it will 'sync' to the even voice, i.e. any
						// time it wraps around, it will reset the next oscillator.
						if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
							remote_.oscillators[c].position &= remote_.oscillators[c].overflow_mask;
							remote_.oscillators[c+1].position = 0;
						}
					}
				break;

				case 6:	// Swap mode; possibly trigger partner, and update sample.
						// Per tech note #11: "Whenever a swap occurs from a higher-numbered
						// oscillator to a lower-numbered one, the output signal from the corresponding
						// generator temporarily falls to the zero-crossing level (silence)"
					if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
						remote_.oscillators[c].control |= 1;
						remote_.oscillators[c].position = 0;
						remote_.oscillators[c^1].control &= ~1;
					}
				break;
			}

			// Don't add output for newly-halted oscillators.
			if(remote_.oscillators[c].control&1) continue;

			// Append new output.
			output += (remote_.oscillators[c].output(remote_.ram_) * next_amplitude) / 255;
			next_amplitude = 255;
		}

		// Maximum total output was 32 channels times a 16-bit range. Map that down.
		// TODO: dynamic total volume?
		Outputs::Speaker::apply<action>(
			target[sample],
			Outputs::Speaker::MonoSample(
				(output * output_range_) >> 20
			)
		);

		// Apply any RAM writes that interleave here.
		++pending_store_read_time_;
		if(!next_store.enabled) continue;
		if(next_store.time != pending_store_read_time_) continue;
		remote_.ram_[next_store.address] = next_store.value;
		next_store.enabled = false;
		pending_stores_[pending_store_read_].store(next_store, std::memory_order::memory_order_relaxed);
		pending_store_read_ = (pending_store_read_ + 1) & (StoreBufferSize - 1);
	}
}